

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  bool bVar1;
  float fVar2;
  float local_3c;
  int local_34;
  int n_1;
  float width_rounded;
  int n;
  int item_n;
  float width_to_remove_per_item;
  float max_width_to_remove_per_item;
  int count_same_width;
  float width_excess_local;
  int count_local;
  ImGuiShrinkWidthItem *items_local;
  
  if (count == 1) {
    if (0.0 <= items->Width) {
      fVar2 = ImMax<float>(items->Width - width_excess,1.0);
      items->Width = fVar2;
    }
  }
  else {
    ImQsort(items,(long)count,0xc,ShrinkWidthItemComparer);
    width_to_remove_per_item = 1.4013e-45;
    for (max_width_to_remove_per_item = width_excess;
        0.0 < max_width_to_remove_per_item && (int)width_to_remove_per_item < count;
        max_width_to_remove_per_item =
             -fVar2 * (float)(int)width_to_remove_per_item + max_width_to_remove_per_item) {
      while( true ) {
        bVar1 = false;
        if ((int)width_to_remove_per_item < count) {
          bVar1 = items->Width <= items[(int)width_to_remove_per_item].Width;
        }
        if (!bVar1) break;
        width_to_remove_per_item = (float)((int)width_to_remove_per_item + 1);
      }
      if ((count <= (int)width_to_remove_per_item) ||
         (items[(int)width_to_remove_per_item].Width < 0.0)) {
        local_3c = items->Width - 1.0;
      }
      else {
        local_3c = items->Width - items[(int)width_to_remove_per_item].Width;
      }
      if (local_3c <= 0.0) break;
      fVar2 = ImMin<float>(max_width_to_remove_per_item / (float)(int)width_to_remove_per_item,
                           local_3c);
      for (width_rounded = 0.0; (int)width_rounded < (int)width_to_remove_per_item;
          width_rounded = (float)((int)width_rounded + 1)) {
        items[(int)width_rounded].Width = items[(int)width_rounded].Width - fVar2;
      }
    }
    max_width_to_remove_per_item = 0.0;
    for (n_1 = 0; n_1 < count; n_1 = n_1 + 1) {
      fVar2 = ImFloor(items[n_1].Width);
      max_width_to_remove_per_item = (items[n_1].Width - fVar2) + max_width_to_remove_per_item;
      items[n_1].Width = fVar2;
    }
    while (0.0 < max_width_to_remove_per_item) {
      for (local_34 = 0; local_34 < count; local_34 = local_34 + 1) {
        if (items[local_34].Width + 1.0 <= items[local_34].InitialWidth) {
          items[local_34].Width = items[local_34].Width + 1.0;
          max_width_to_remove_per_item = max_width_to_remove_per_item - 1.0;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    while (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Width + 1.0f <= items[n].InitialWidth)
            {
                items[n].Width += 1.0f;
                width_excess -= 1.0f;
            }
}